

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void writeBits(LodePNGBitWriter *writer,uint value,size_t nbits)

{
  uint uVar1;
  long lVar2;
  ucvector *in_RDX;
  uint in_ESI;
  long *in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffffd8;
  ucvector *in_stack_ffffffffffffffe0;
  ucvector *p;
  
  if (in_RDX == (ucvector *)0x1) {
    if ((*(byte *)(in_RDI + 1) & 7) == 0) {
      uVar1 = ucvector_resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      if (uVar1 == 0) {
        return;
      }
      *(undefined1 *)(*(long *)*in_RDI + *(long *)(*in_RDI + 8) + -1) = 0;
    }
    lVar2 = *(long *)(*in_RDI + 8) + -1;
    *(byte *)(*(long *)*in_RDI + lVar2) =
         *(byte *)(*(long *)*in_RDI + lVar2) | (byte)(in_ESI << (*(byte *)(in_RDI + 1) & 7));
    *(char *)(in_RDI + 1) = (char)in_RDI[1] + '\x01';
  }
  else {
    for (p = (ucvector *)0x0; p != in_RDX; p = (ucvector *)((long)&p->data + 1)) {
      if ((*(byte *)(in_RDI + 1) & 7) == 0) {
        uVar1 = ucvector_resize(p,in_stack_ffffffffffffffd8);
        if (uVar1 == 0) {
          return;
        }
        *(undefined1 *)(*(long *)*in_RDI + *(long *)(*in_RDI + 8) + -1) = 0;
      }
      lVar2 = *(long *)(*in_RDI + 8) + -1;
      *(byte *)(*(long *)*in_RDI + lVar2) =
           *(byte *)(*(long *)*in_RDI + lVar2) |
           (byte)((in_ESI >> ((byte)p & 0x1f) & 1) << (*(byte *)(in_RDI + 1) & 7));
      *(char *)(in_RDI + 1) = (char)in_RDI[1] + '\x01';
    }
  }
  return;
}

Assistant:

static void writeBits(LodePNGBitWriter* writer, unsigned value, size_t nbits) {
  if(nbits == 1) { /* compiler should statically compile this case if nbits == 1 */
    WRITEBIT(writer, value);
  } else {
    /* TODO: increase output size only once here rather than in each WRITEBIT */
    size_t i;
    for(i = 0; i != nbits; ++i) {
      WRITEBIT(writer, (unsigned char)((value >> i) & 1));
    }
  }
}